

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void * stbiw__sbgrowf(void **arr,int increment,int itemsize)

{
  void *pvVar1;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  void *p;
  int m;
  void *local_30;
  int local_24;
  
  if (*in_RDI == 0) {
    local_24 = in_ESI + 1;
  }
  else {
    local_24 = *(int *)(*in_RDI + -8) * 2 + in_ESI;
  }
  if (*in_RDI == 0) {
    local_30 = (void *)0x0;
  }
  else {
    local_30 = (void *)(*in_RDI + -8);
  }
  pvVar1 = realloc(local_30,(long)(in_EDX * local_24) + 8);
  if (pvVar1 != (void *)0x0) {
    if (pvVar1 != (void *)0x0) {
      if (*in_RDI == 0) {
        *(undefined4 *)((long)pvVar1 + 4) = 0;
      }
      *in_RDI = (long)pvVar1 + 8;
      *(int *)(*in_RDI + -8) = local_24;
    }
    return (void *)*in_RDI;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image_write.h"
                ,0x319,"void *stbiw__sbgrowf(void **, int, int)");
}

Assistant:

static void *stbiw__sbgrowf(void **arr, int increment, int itemsize)
{
   int m = *arr ? 2*stbiw__sbm(*arr)+increment : increment+1;
   void *p = STBIW_REALLOC_SIZED(*arr ? stbiw__sbraw(*arr) : 0, *arr ? (stbiw__sbm(*arr)*itemsize + sizeof(int)*2) : 0, itemsize * m + sizeof(int)*2);
   STBIW_ASSERT(p);
   if (p) {
      if (!*arr) ((int *) p)[1] = 0;
      *arr = (void *) ((int *) p + 2);
      stbiw__sbm(*arr) = m;
   }
   return *arr;
}